

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFile.cpp
# Opt level: O1

ExistingFileNamer * __thiscall
ApprovalTests::ExistingFile::getNamer(ExistingFileNamer *__return_storage_ptr__,ExistingFile *this)

{
  pointer pcVar1;
  string local_40;
  
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->filePath)._M_string_length);
  ExistingFileNamer::ExistingFileNamer(__return_storage_ptr__,&local_40,this->options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ExistingFileNamer ExistingFile::getNamer()
    {
        return ExistingFileNamer(filePath, options_);
    }